

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O2

void __thiscall XPMP2::SoundSystemXP::ChnSetVol(SoundSystemXP *this,SoundChannel *chn)

{
  FMOD_RESULT _r;
  float fVar1;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  FmodError local_68;
  
  if (chn->pChn != (FMOD_CHANNEL *)0x0) {
    fVar1 = 0.0;
    if ((chn->bMuted == false) && (this->bAllMuted == false)) {
      fVar1 = chn->vol * this->volMaster;
    }
    gFmodRes = (*gpXPLMSetAudioVolume)(fVar1);
    if (gFmodRes != FMOD_OK) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,
                 "gpXPLMSetAudioVolume(chn.pChn, chn.bMuted || bAllMuted ? 0.0f : (chn.vol * volMaster))"
                 ,&local_c9);
      _r = gFmodRes;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
                 ,&local_ca);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"ChnSetVol",&local_cb);
      FmodError::FmodError(&local_68,&local_88,_r,&local_a8,0x284,&local_c8);
      FmodError::LogErr(&local_68);
      FmodError::~FmodError(&local_68);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  return;
}

Assistant:

void SoundSystemXP::ChnSetVol (const SoundChannel& chn)
{
    if (!chn.pChn) return;
    FMOD_LOG(gpXPLMSetAudioVolume(chn.pChn,
                                  chn.bMuted || bAllMuted ? 0.0f : (chn.vol * volMaster)));
}